

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O0

bool __thiscall FParser::spec_if(FParser *this)

{
  int iVar1;
  char *pcVar2;
  bool ifresult;
  undefined1 local_38 [8];
  svalue_t eval;
  int endtoken;
  FParser *this_local;
  
  svalue_t::svalue_t((svalue_t *)local_38);
  eval.value._4_4_ = FindOperator(this,0,this->NumTokens + -1,")");
  if (eval.value._4_4_ == -1) {
    script_error("parse error in if statement\n");
    this_local._7_1_ = false;
  }
  else {
    EvaluateExpression(this,(svalue_t *)local_38,2,eval.value._4_4_ + -1);
    iVar1 = intvalue((svalue_t *)local_38);
    this_local._7_1_ = iVar1 != 0;
    if (((this->Section == (DFsSection *)0x0) || (this->BraceType != 0)) ||
       (eval.value._4_4_ != this->NumTokens + -1)) {
      if ((this_local._7_1_) && (eval.value._4_4_ != this->NumTokens + -1)) {
        EvaluateExpression(this,(svalue_t *)local_38,eval.value._4_4_ + 1,this->NumTokens + -1);
      }
    }
    else if (!this_local._7_1_) {
      pcVar2 = DFsScript::SectionEnd(this->Script,this->Section);
      this->Rover = pcVar2 + 1;
    }
  }
  svalue_t::~svalue_t((svalue_t *)local_38);
  return this_local._7_1_;
}

Assistant:

bool FParser::spec_if()
{
	int endtoken;
	svalue_t eval;
	
	
	if((endtoken = FindOperator(0, NumTokens-1, ")")) == -1)
    {
		script_error("parse error in if statement\n");
		return false;
    }
	
	// 2 to skip past the 'if' and '('
	EvaluateExpression(eval, 2, endtoken-1);
	bool ifresult = !!intvalue(eval);
	
	if(Section && BraceType == bracket_open && endtoken == NumTokens-1)
    {
		// {} braces
		if(!ifresult)       // skip to end of section
			Rover = Script->SectionEnd(Section) + 1;
    }
	else if(ifresult) // if() without {} braces
	{
		// nothing to do ?
		if(endtoken != NumTokens-1)
			EvaluateExpression(eval, endtoken+1, NumTokens-1);
	}
	
	return ifresult;
}